

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int encodeURI_hex(StringBuffer *b,int c)

{
  undefined3 uVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint8_t buf [6];
  undefined8 uStack_8;
  
  uStack_8._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
  uStack_8._0_3_ = CONCAT12(0x25,(short)in_RAX);
  uVar1 = (undefined3)uStack_8;
  uVar2 = 1;
  if (0xff < c) {
    uStack_8._0_4_ = CONCAT13(0x75,uVar1);
    uVar2 = 4;
  }
  *(char *)((long)&uStack_8 + (ulong)uVar2 + 2) = "0123456789ABCDEF"[(uint)c >> 4 & 0xf];
  *(char *)((long)&uStack_8 + (ulong)uVar2 + 3) = "0123456789ABCDEF"[c & 0xf];
  string_buffer_write8(b,(uint8_t *)((long)&uStack_8 + 2),uVar2 | 2);
  return (int)uStack_8;
}

Assistant:

static int encodeURI_hex(StringBuffer *b, int c) {
    uint8_t buf[6];
    int n = 0;
    const char *hex = "0123456789ABCDEF";

    buf[n++] = '%';
    if (c >= 256) {
        buf[n++] = 'u';
        buf[n++] = hex[(c >> 12) & 15];
        buf[n++] = hex[(c >>  8) & 15];
    }
    buf[n++] = hex[(c >> 4) & 15];
    buf[n++] = hex[(c >> 0) & 15];
    return string_buffer_write8(b, buf, n);
}